

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O2

trt_node *
troc_modi_next_sibling(trt_node *__return_storage_ptr__,trt_parent_cache ca,trt_tree_ctx *tc)

{
  lysc_node *plVar1;
  lysp_node_list *extraout_RDX;
  trt_tree_ctx *ptVar2;
  trt_parent_cache ca_00;
  
  if ((tc != (trt_tree_ctx *)0x0) && (tc->cn != (lysc_node *)0x0)) {
    ptVar2 = tc;
    plVar1 = (lysc_node *)tro_next_sibling(tc->cn,tc);
    if (plVar1 == (lysc_node *)0x0) {
      (__return_storage_ptr__->name).str = (char *)0x0;
      (__return_storage_ptr__->name).add_opts = (char *)0x0;
      (__return_storage_ptr__->name).type = TRD_NODE_ELSE;
      (__return_storage_ptr__->name).keys = '\0';
      *(undefined3 *)&(__return_storage_ptr__->name).field_0x5 = 0;
      (__return_storage_ptr__->name).module_prefix = (char *)0x0;
      __return_storage_ptr__->status = (char *)0x0;
      __return_storage_ptr__->flags = (char *)0x0;
      (__return_storage_ptr__->name).opts = (char *)0x0;
      (__return_storage_ptr__->type).type = TRD_TYPE_EMPTY;
      (__return_storage_ptr__->type).str = (char *)0x0;
      (__return_storage_ptr__->iffeatures).type = TRD_IFF_NON_PRESENT;
      (__return_storage_ptr__->iffeatures).str = (char *)0x0;
      __return_storage_ptr__->last_one = '\x01';
    }
    else {
      tc->cn = plVar1;
      ca_00.last_list = extraout_RDX;
      ca_00._0_8_ = ptVar2;
      troc_read_node(__return_storage_ptr__,ca_00,tc);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("tc && tc->cn",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_tree.c"
                ,0xd32,
                "struct trt_node troc_modi_next_sibling(struct trt_parent_cache, struct trt_tree_ctx *)"
               );
}

Assistant:

static struct trt_node
troc_modi_next_sibling(struct trt_parent_cache ca, struct trt_tree_ctx *tc)
{
    const struct lysc_node *cn;

    assert(tc && tc->cn);

    cn = tro_next_sibling(tc->cn, tc);

    /* if next sibling exists */
    if (cn) {
        /* update trt_tree_ctx */
        tc->cn = cn;
        return troc_read_node(ca, tc);
    } else {
        return TRP_EMPTY_NODE;
    }
}